

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryInvocationCase::init
          (GeometryInvocationCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  OutputCase testCase;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *pNVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  InvocationCountShader *this_01;
  EVP_PKEY_CTX *ctx_00;
  int local_514;
  MessageBuilder local_510;
  MessageBuilder local_390;
  undefined1 local_20a;
  allocator<char> local_209;
  string local_208;
  undefined4 local_1e4;
  int local_1e0;
  int numComponents;
  int maxEmitCount;
  MessageBuilder local_1b8;
  deUint32 local_28;
  ContextType local_24;
  int local_20;
  int local_1c;
  int maxComponents;
  int maxGeometryShaderInvocations;
  Functions *gl;
  GeometryInvocationCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _maxComponents = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  local_20 = 0;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_24.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_28 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_24,(ApiType)local_28);
  if (!bVar1) {
    this_00 = gles31::Context::getContextInfo
                        ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (!bVar1) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"Tests require GL_EXT_geometry_shader extension or higher context version.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x10e8);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  (**(code **)(_maxComponents + 0x868))(0x8e5a,&local_1c);
  dVar3 = (**(code **)(_maxComponents + 0x800))();
  glu::checkError(dVar3,"getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x10eb);
  (**(code **)(_maxComponents + 0x868))(0x8de1,&local_20);
  dVar3 = (**(code **)(_maxComponents + 0x800))();
  glu::checkError(dVar3,"getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x10ee);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [38])0x2c2a5de);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  if (this->m_numInvocations == -1) {
    this->m_numInvocations = local_1c;
  }
  else if (local_1c < this->m_numInvocations) {
    numComponents._2_1_ = 1;
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxEmitCount,"Test requires larger GL_MAX_GEOMETRY_SHADER_INVOCATIONS",
               (allocator<char> *)((long)&numComponents + 3));
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&maxEmitCount);
    numComponents._2_1_ = 0;
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (this->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
    local_1e0 = this->m_numInvocations + 2;
    local_1e4 = 8;
    if (local_20 < local_1e0 * 8) {
      local_20a = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Test requires larger GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS"
                 ,&local_209);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_208);
      local_20a = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_390,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_390,
                        (char (*) [128])
                        "Rendering triangles in a partial circle formation with a geometry shader. Each triangle is generated by a separate invocation.\n"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [35])"Drawing 2 points, each generating ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numInvocations);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2bf3fd6);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_390);
  }
  else if (this->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_510,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_510,
                        (char (*) [122])
                        "Rendering n-gons in a partial circle formation with a geometry shader. Each n-gon is generated by a separate invocation.\n"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [35])"Drawing 2 points, each generating ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numInvocations);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])" n-gons.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_510);
  }
  this_01 = (InvocationCountShader *)operator_new(0x160);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_514 = (*pRVar4->_vptr_RenderContext[2])();
  iVar2 = this->m_numInvocations;
  testCase = mapToShaderCaseType(this->m_testCase);
  ctx_00 = (EVP_PKEY_CTX *)&local_514;
  InvocationCountShader::InvocationCountShader(this_01,(ContextType *)ctx_00,iVar2,testCase);
  this->m_program = this_01;
  iVar2 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar2;
}

Assistant:

void GeometryInvocationCase::init (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	int						maxGeometryShaderInvocations	= 0;
	int						maxComponents					= 0;

	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS, &maxGeometryShaderInvocations);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS)");

	gl.getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS)");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_INVOCATIONS = " << maxGeometryShaderInvocations << tcu::TestLog::EndMessage;

	// set target num invocations

	if (m_numInvocations == -1)
		m_numInvocations = maxGeometryShaderInvocations;
	else if (maxGeometryShaderInvocations < m_numInvocations)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_GEOMETRY_SHADER_INVOCATIONS");

	if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
	{
		const int maxEmitCount	= m_numInvocations + 2;
		const int numComponents	= 8; // pos + color
		if (maxEmitCount * numComponents > maxComponents)
			throw tcu::NotSupportedError("Test requires larger GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS");
	}

	// Log what the test tries to do

	if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Rendering triangles in a partial circle formation with a geometry shader. Each triangle is generated by a separate invocation.\n"
			<< "Drawing 2 points, each generating " << m_numInvocations << " triangles."
			<< tcu::TestLog::EndMessage;
	}
	else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Rendering n-gons in a partial circle formation with a geometry shader. Each n-gon is generated by a separate invocation.\n"
			<< "Drawing 2 points, each generating " << m_numInvocations << " n-gons."
			<< tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(false);

	// resources

	m_program = new InvocationCountShader(m_context.getRenderContext().getType(), m_numInvocations, mapToShaderCaseType(m_testCase));

	GeometryShaderRenderTest::init();
}